

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O1

void Hacl_Hash_SHA3_shake128_absorb_final(uint64_t *state,uint8_t *input,uint32_t inputByteLen)

{
  uint8_t *puVar1;
  uint32_t i;
  long lVar2;
  ulong __n;
  uint64_t ws [32];
  uint8_t b1 [256];
  uint8_t b2 [256];
  ulong local_328 [25];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  ulong local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  uint8_t local_128 [167];
  undefined1 local_81;
  
  lVar2 = 0;
  memset(&local_228,0,0x100);
  __n = (ulong)(inputByteLen % 0xa8);
  memcpy(&local_228,input + (inputByteLen - __n),__n);
  *(undefined1 *)((long)&local_228 + __n) = 0x1f;
  memset(local_328,0,0x100);
  local_328[0] = local_228;
  local_328[1] = local_220;
  local_328[2] = uStack_218;
  local_328[3] = local_210;
  local_328[4] = uStack_208;
  local_328[5] = local_200;
  local_328[6] = uStack_1f8;
  local_328[7] = local_1f0;
  local_328[8] = uStack_1e8;
  local_328[9] = local_1e0;
  local_328[10] = uStack_1d8;
  local_328[0xb] = local_1d0;
  local_328[0xc] = uStack_1c8;
  local_328[0xd] = local_1c0;
  local_328[0xe] = uStack_1b8;
  local_328[0xf] = local_1b0;
  local_328[0x10] = local_1a8;
  local_328[0x11] = local_1a0;
  local_328[0x12] = uStack_198;
  local_328[0x13] = local_190;
  local_328[0x14] = uStack_188;
  local_328[0x15] = local_180;
  local_328[0x16] = uStack_178;
  local_328[0x17] = local_170;
  local_328[0x18] = uStack_168;
  local_260 = local_160;
  uStack_258 = uStack_158;
  local_250 = local_150;
  uStack_248 = uStack_148;
  local_240 = local_140;
  uStack_238 = uStack_138;
  local_230 = local_130;
  do {
    state[lVar2] = state[lVar2] ^ local_328[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x19);
  puVar1 = local_128;
  memset(local_128,0,0x100);
  local_81 = 0x80;
  Hacl_Hash_SHA3_absorb_inner_32((uint32_t)puVar1,local_128,state);
  return;
}

Assistant:

void
Hacl_Hash_SHA3_shake128_absorb_final(uint64_t *state, uint8_t *input, uint32_t inputByteLen)
{
  uint8_t b1[256U] = { 0U };
  uint8_t *b_ = b1;
  uint32_t rem = inputByteLen % 168U;
  uint8_t *b00 = input;
  uint8_t *bl0 = b_;
  memcpy(bl0, b00 + inputByteLen - rem, rem * sizeof (uint8_t));
  uint8_t *b01 = b_;
  b01[inputByteLen % 168U] = 0x1FU;
  uint64_t ws[32U] = { 0U };
  uint8_t *b = b_;
  uint64_t u = load64_le(b);
  ws[0U] = u;
  uint64_t u0 = load64_le(b + 8U);
  ws[1U] = u0;
  uint64_t u1 = load64_le(b + 16U);
  ws[2U] = u1;
  uint64_t u2 = load64_le(b + 24U);
  ws[3U] = u2;
  uint64_t u3 = load64_le(b + 32U);
  ws[4U] = u3;
  uint64_t u4 = load64_le(b + 40U);
  ws[5U] = u4;
  uint64_t u5 = load64_le(b + 48U);
  ws[6U] = u5;
  uint64_t u6 = load64_le(b + 56U);
  ws[7U] = u6;
  uint64_t u7 = load64_le(b + 64U);
  ws[8U] = u7;
  uint64_t u8 = load64_le(b + 72U);
  ws[9U] = u8;
  uint64_t u9 = load64_le(b + 80U);
  ws[10U] = u9;
  uint64_t u10 = load64_le(b + 88U);
  ws[11U] = u10;
  uint64_t u11 = load64_le(b + 96U);
  ws[12U] = u11;
  uint64_t u12 = load64_le(b + 104U);
  ws[13U] = u12;
  uint64_t u13 = load64_le(b + 112U);
  ws[14U] = u13;
  uint64_t u14 = load64_le(b + 120U);
  ws[15U] = u14;
  uint64_t u15 = load64_le(b + 128U);
  ws[16U] = u15;
  uint64_t u16 = load64_le(b + 136U);
  ws[17U] = u16;
  uint64_t u17 = load64_le(b + 144U);
  ws[18U] = u17;
  uint64_t u18 = load64_le(b + 152U);
  ws[19U] = u18;
  uint64_t u19 = load64_le(b + 160U);
  ws[20U] = u19;
  uint64_t u20 = load64_le(b + 168U);
  ws[21U] = u20;
  uint64_t u21 = load64_le(b + 176U);
  ws[22U] = u21;
  uint64_t u22 = load64_le(b + 184U);
  ws[23U] = u22;
  uint64_t u23 = load64_le(b + 192U);
  ws[24U] = u23;
  uint64_t u24 = load64_le(b + 200U);
  ws[25U] = u24;
  uint64_t u25 = load64_le(b + 208U);
  ws[26U] = u25;
  uint64_t u26 = load64_le(b + 216U);
  ws[27U] = u26;
  uint64_t u27 = load64_le(b + 224U);
  ws[28U] = u27;
  uint64_t u28 = load64_le(b + 232U);
  ws[29U] = u28;
  uint64_t u29 = load64_le(b + 240U);
  ws[30U] = u29;
  uint64_t u30 = load64_le(b + 248U);
  ws[31U] = u30;
  for (uint32_t i = 0U; i < 25U; i++)
  {
    state[i] = state[i] ^ ws[i];
  }
  uint8_t b2[256U] = { 0U };
  uint8_t *b3 = b2;
  uint8_t *b0 = b3;
  b0[167U] = 0x80U;
  Hacl_Hash_SHA3_absorb_inner_32(168U, b3, state);
}